

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  pointer pcVar1;
  cmCTest *this_00;
  char cVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  cmCTestTestHandler *pcVar5;
  bool bVar6;
  int iVar7;
  unsigned_long length;
  uchar *puVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  ulong *puVar12;
  size_type *psVar13;
  ulong uVar14;
  string k2;
  string v2;
  ostringstream ostr;
  ifstream ifs;
  string cxml;
  RegularExpression measurementfile;
  RegularExpression fourattributes;
  RegularExpression twoattributes;
  RegularExpression threeattributes;
  RegularExpression cdatastart;
  RegularExpression cdataend;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  string local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [3];
  ios_base local_8b0 [264];
  undefined1 local_7a8 [112];
  ios_base local_738 [408];
  long *local_5a0 [2];
  long local_590 [2];
  string local_580;
  uchar *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  cmCTestTestHandler *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_370.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_370,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_2a0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_2a0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_440.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_440,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_1d0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"]]>[ \t\r\n]*</DartMeasurement>");
  local_510.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_510,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  local_5a0[0] = local_590;
  pcVar1 = (dart->_M_dataplus)._M_p;
  local_538 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5a0,pcVar1,pcVar1 + dart->_M_string_length);
  do {
    while( true ) {
      bVar6 = cmsys::RegularExpression::find(&local_370,(char *)local_5a0[0]);
      if (!bVar6) break;
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_370.startp[1] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_370.startp[1],local_370.endp[1]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_370.startp[2] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.startp[2],local_370.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_370.startp[3] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_370.startp[3],local_370.endp[3]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_370.startp[4] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.startp[4],local_370.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Value","");
      if (local_370.startp[5] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.startp[5],local_370.endp[5]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_920);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar14 = (long)local_370.startp[0] - (long)local_370.searchstring;
LAB_002f4c6e:
      std::__cxx11::string::erase((ulong)local_5a0,uVar14);
    }
    bVar6 = cmsys::RegularExpression::find(&local_2a0,(char *)local_5a0[0]);
    if (bVar6) {
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_2a0.startp[1] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_2a0.startp[1],local_2a0.endp[1]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_2a0.startp[2] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.startp[2],local_2a0.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_2a0.startp[3] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_2a0.startp[3],local_2a0.endp[3]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_2a0.startp[4] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.startp[4],local_2a0.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_2a0.startp[5] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_2a0.startp[5],local_2a0.endp[5]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_2a0.startp[6] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.startp[6],local_2a0.endp[6]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Value","");
      if (local_370.startp[7] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.startp[7],local_370.endp[7]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_920);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar14 = (long)local_2a0.startp[0] - (long)local_2a0.searchstring;
      goto LAB_002f4c6e;
    }
    bVar6 = cmsys::RegularExpression::find(&local_440,(char *)local_5a0[0]);
    if (bVar6) {
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_440.startp[1] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_440.startp[1],local_440.endp[1]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_440.startp[2] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.startp[2],local_440.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_440.startp[3] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_440.startp[3],local_440.endp[3]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_440.startp[4] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.startp[4],local_440.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_440.startp[5] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_440.startp[5],local_440.endp[5]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_440.startp[6] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.startp[6],local_440.endp[6]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_440.startp[7] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_440.startp[7],local_440.endp[7]);
      }
      uVar4 = local_7a8._0_8_;
      if (local_440.startp[8] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.startp[8],local_440.endp[8]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Value","");
      if (local_370.startp[9] == (char *)0x0) {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        local_920[0]._M_string_length = 0;
        local_920[0].field_2._M_allocated_capacity =
             local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.startp[9],local_370.endp[9]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_920);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar14 = (long)local_440.startp[0] - (long)local_440.searchstring;
      goto LAB_002f4c6e;
    }
    bVar6 = cmsys::RegularExpression::find(&local_1d0,(char *)local_5a0[0]);
    if (bVar6) {
      bVar6 = cmsys::RegularExpression::find(&local_100,(char *)local_5a0[0]);
      if (bVar6) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_7a8);
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
        if (local_1d0.startp[1] == (char *)0x0) {
          local_7a8._0_8_ = local_7a8 + 0x10;
          local_7a8._8_8_ = 0;
          local_7a8[0x10] = '\0';
        }
        else {
          local_7a8._0_8_ = local_7a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7a8,local_1d0.startp[1],local_1d0.endp[1]);
        }
        uVar4 = local_7a8._0_8_;
        if (local_1d0.startp[2] == (char *)0x0) {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          local_920[0]._M_string_length = 0;
          local_920[0].field_2._M_allocated_capacity =
               local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_1d0.startp[2],local_1d0.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
        if (local_1d0.startp[3] == (char *)0x0) {
          local_7a8._0_8_ = local_7a8 + 0x10;
          local_7a8._8_8_ = 0;
          local_7a8[0x10] = '\0';
        }
        else {
          local_7a8._0_8_ = local_7a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7a8,local_1d0.startp[3],local_1d0.endp[3]);
        }
        uVar4 = local_7a8._0_8_;
        if (local_1d0.startp[4] == (char *)0x0) {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          local_920[0]._M_string_length = 0;
          local_920[0].field_2._M_allocated_capacity =
               local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_1d0.startp[4],local_1d0.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_920);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Value","");
        cmXMLWriter::StartElement(xml,(string *)local_7a8);
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
        std::__cxx11::string::substr((ulong)local_7a8,(ulong)local_5a0);
        cmXMLWriter::CData(xml,(string *)local_7a8);
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        uVar14 = (long)local_1d0.startp[0] - (long)local_1d0.searchstring;
        goto LAB_002f4c6e;
      }
    }
    bVar6 = cmsys::RegularExpression::find(&local_510,(char *)local_5a0[0]);
    if (!bVar6) {
      if (local_5a0[0] != local_590) {
        operator_delete(local_5a0[0],local_590[0] + 1);
      }
      if (local_510.program != (char *)0x0) {
        operator_delete__(local_510.program);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_1d0.program != (char *)0x0) {
        operator_delete__(local_1d0.program);
      }
      if (local_440.program != (char *)0x0) {
        operator_delete__(local_440.program);
      }
      if (local_2a0.program != (char *)0x0) {
        operator_delete__(local_2a0.program);
      }
      if (local_370.program != (char *)0x0) {
        operator_delete__(local_370.program);
      }
      return;
    }
    if (local_510.startp[5] == (char *)0x0) {
      local_7a8._0_8_ = local_7a8 + 0x10;
      local_7a8._8_8_ = 0;
      local_7a8[0x10] = '\0';
    }
    else {
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7a8,local_510.startp[5],local_510.endp[5]);
    }
    cmCTest::CleanString(&local_580,(string *)local_7a8);
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
    }
    bVar6 = cmsys::SystemTools::FileExists(local_580._M_dataplus._M_p);
    if (bVar6) {
      length = cmsys::SystemTools::FileLength(&local_580);
      if (length == 0) {
        if (local_510.startp[1] == (char *)0x0) {
          local_7a8._0_8_ = local_7a8 + 0x10;
          local_7a8._8_8_ = 0;
          local_7a8[0x10] = '\0';
        }
        else {
          local_7a8._0_8_ = local_7a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7a8,local_510.startp[1],local_510.endp[1]);
        }
        if (local_510.startp[2] == (char *)0x0) {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          local_920[0]._M_string_length = 0;
          local_920[0].field_2._M_allocated_capacity =
               local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_510.startp[2],local_510.endp[2]);
        }
        if (local_510.startp[3] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.startp[3],local_510.endp[3]);
        }
        if (local_510.startp[4] == (char *)0x0) {
          local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
          local_940._M_string_length = 0;
          local_940.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_940,local_510.startp[4],local_510.endp[4]);
        }
        cmsys::SystemTools::LowerCase(&local_960,(string *)local_7a8);
        iVar7 = std::__cxx11::string::compare((char *)&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_920,0,(char *)local_920[0]._M_string_length,0x630181);
        }
        cmsys::SystemTools::LowerCase(&local_960,&local_980);
        iVar7 = std::__cxx11::string::compare((char *)&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_940,0,(char *)local_940._M_string_length,0x630181);
        }
        local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)local_7a8._0_8_,local_920);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,local_980._M_dataplus._M_p,&local_940);
        cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x68be5a);
        local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"Value","");
        std::operator+(&local_530,"Image ",&local_580);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_530);
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_558.field_2._M_allocated_capacity = *psVar13;
          local_558.field_2._8_8_ = plVar11[3];
        }
        else {
          local_558.field_2._M_allocated_capacity = *psVar13;
          local_558._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_558._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        cmXMLWriter::StartElement(xml,&local_960);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_558);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p,
                          CONCAT71(local_940.field_2._M_allocated_capacity._1_7_,
                                   local_940.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
          operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
        }
      }
      else {
        std::ifstream::ifstream(local_7a8,local_580._M_dataplus._M_p,_S_in);
        puVar8 = (uchar *)operator_new__(length + 1);
        std::istream::read(local_7a8,(long)puVar8);
        local_560 = puVar8;
        puVar8 = (uchar *)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
        sVar9 = cmsysBase64_Encode(local_560,length,puVar8,1);
        local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,local_920);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        if (local_510.startp[1] == (char *)0x0) {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          local_920[0]._M_string_length = 0;
          local_920[0].field_2._M_allocated_capacity =
               local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_510.startp[1],local_510.endp[1]);
        }
        _Var3._M_p = local_920[0]._M_dataplus._M_p;
        if (local_510.startp[2] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.startp[2],local_510.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var3._M_p,&local_980);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        if (local_510.startp[3] == (char *)0x0) {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          local_920[0]._M_string_length = 0;
          local_920[0].field_2._M_allocated_capacity =
               local_920[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_510.startp[3],local_510.endp[3]);
        }
        _Var3._M_p = local_920[0]._M_dataplus._M_p;
        if (local_510.startp[4] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.startp[4],local_510.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var3._M_p,&local_980);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
          operator_delete(local_920[0]._M_dataplus._M_p,
                          local_920[0].field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_920);
        if (sVar9 != 0) {
          uVar14 = 0;
          do {
            local_980._M_dataplus._M_p._0_1_ = puVar8[uVar14];
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_920,(char *)&local_980,1);
            if ((uVar14 != 0) && ((uVar14 / 0x3c) * 0x3c - uVar14 == 0)) {
              cVar2 = (char)local_920;
              std::ios::widen((char)*(undefined8 *)(local_920[0]._M_dataplus._M_p + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
            }
            uVar14 = uVar14 + 1;
          } while (sVar9 != uVar14);
        }
        local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"Value","");
        std::__cxx11::stringbuf::str();
        cmXMLWriter::StartElement(xml,&local_980);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_940);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p,
                          CONCAT71(local_940.field_2._M_allocated_capacity._1_7_,
                                   local_940.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        operator_delete__(local_560);
        operator_delete__(puVar8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_920);
        std::ios_base::~ios_base(local_8b0);
        std::ifstream::~ifstream(local_7a8);
      }
    }
    else {
      if (local_510.startp[1] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_510.startp[1],local_510.endp[1]);
      }
      iVar7 = std::__cxx11::string::compare(local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      if (local_510.startp[(ulong)(iVar7 != 0) * 2 + 2] == (char *)0x0) {
        local_7a8._0_8_ = local_7a8 + 0x10;
        local_7a8._8_8_ = 0;
        local_7a8[0x10] = '\0';
      }
      else {
        local_7a8._0_8_ = local_7a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,local_510.startp[(ulong)(iVar7 != 0) * 2 + 2],
                   local_510.endp[(ulong)(iVar7 != 0) * 2 + 2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8);
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
      local_7a8._0_8_ = local_7a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Value","");
      std::operator+(&local_980,"File ",&local_580);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_980);
      local_920[0]._M_dataplus._M_p = (pointer)&local_920[0].field_2;
      puVar12 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_920[0].field_2._0_8_ = *puVar12;
        local_920[0].field_2._8_8_ = plVar11[3];
      }
      else {
        local_920[0].field_2._0_8_ = *puVar12;
        local_920[0]._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_920[0]._M_string_length = plVar11[1];
      *plVar11 = (long)puVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmXMLWriter::StartElement(xml,(string *)local_7a8);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_920);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_980._M_dataplus._M_p != &local_980.field_2) {
        operator_delete(local_980._M_dataplus._M_p,
                        CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                 local_980.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
        operator_delete((void *)local_7a8._0_8_,CONCAT71(local_7a8._17_7_,local_7a8[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7a8,"File \"",6);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_7a8,local_580._M_dataplus._M_p,
                           local_580._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" not found.",0xc);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar5 = local_538;
      this_00 = (local_538->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x844,local_920[0]._M_dataplus._M_p,(pcVar5->super_cmCTestGenericHandler).Quiet)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920[0]._M_dataplus._M_p != &local_920[0].field_2) {
        operator_delete(local_920[0]._M_dataplus._M_p,local_920[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a8);
      std::ios_base::~ios_base(local_738);
    }
    std::__cxx11::string::erase
              ((ulong)local_5a0,(long)local_510.startp[0] - (long)local_510.searchstring);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename.c_str())) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(), std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
                              );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "File \""
                             << filename << "\" not found." << std::endl,
                           this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}